

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int reparse_relative_location_path(ly_ctx *ctx,lyxp_expr *exp,uint16_t *exp_idx)

{
  int iVar1;
  char *pcVar2;
  uint16_t uVar3;
  ushort uVar4;
  uint uVar5;
  lyxp_token tok;
  
  iVar1 = exp_check_token(ctx,exp,*exp_idx,LYXP_TOKEN_NONE,1);
  if (iVar1 != 0) {
    return -1;
  }
  do {
    uVar4 = *exp_idx;
    tok = exp->tokens[uVar4];
    switch(tok) {
    case LYXP_TOKEN_DOT:
    case LYXP_TOKEN_DDOT:
      uVar5 = uVar4 + 1;
      *exp_idx = (uint16_t)uVar5;
      goto LAB_001714b9;
    case LYXP_TOKEN_AT:
      *exp_idx = uVar4 + 1;
      iVar1 = exp_check_token(ctx,exp,uVar4 + 1,LYXP_TOKEN_NONE,1);
      if (iVar1 != 0) {
        return -1;
      }
      uVar4 = *exp_idx;
      tok = exp->tokens[uVar4];
      if (1 < tok - LYXP_TOKEN_NAMETEST) goto switchD_001714b1_caseD_8;
      break;
    default:
switchD_001714b1_caseD_8:
      pcVar2 = print_token(tok);
      ly_vlog(ctx,LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,pcVar2,
              exp->expr + exp->expr_pos[*exp_idx]);
      return -1;
    case LYXP_TOKEN_NAMETEST:
      break;
    case LYXP_TOKEN_NODETYPE:
      *exp_idx = uVar4 + 1;
      iVar1 = exp_check_token(ctx,exp,uVar4 + 1,LYXP_TOKEN_PAR1,1);
      if (iVar1 != 0) {
        return -1;
      }
      uVar3 = *exp_idx;
      *exp_idx = uVar3 + 1;
      iVar1 = exp_check_token(ctx,exp,uVar3 + 1,LYXP_TOKEN_PAR2,1);
      if (iVar1 != 0) {
        return -1;
      }
      uVar4 = *exp_idx;
    }
    *exp_idx = uVar4 + 1;
    while ((uVar5 = (uint)*exp_idx, *exp_idx < exp->used &&
           (exp->tokens[uVar5] == LYXP_TOKEN_BRACK1))) {
      iVar1 = reparse_predicate(ctx,exp,exp_idx);
      if (iVar1 != 0) {
        return -1;
      }
    }
LAB_001714b9:
    if (exp->used <= (ushort)uVar5) {
      return 0;
    }
    if (exp->tokens[uVar5 & 0xffff] != LYXP_TOKEN_OPERATOR_PATH) {
      return 0;
    }
    uVar3 = (ushort)uVar5 + 1;
    *exp_idx = uVar3;
    iVar1 = exp_check_token(ctx,exp,uVar3,LYXP_TOKEN_NONE,1);
    if (iVar1 != 0) {
      return -1;
    }
  } while( true );
}

Assistant:

static int
reparse_relative_location_path(struct ly_ctx *ctx, struct lyxp_expr *exp, uint16_t *exp_idx)
{
    if (exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_NONE, 1)) {
        return -1;
    }

    goto step;
    do {
        /* '/' or '//' */
        ++(*exp_idx);

        if (exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_NONE, 1)) {
            return -1;
        }
step:
        /* Step */
        switch (exp->tokens[*exp_idx]) {
        case LYXP_TOKEN_DOT:
            ++(*exp_idx);
            break;

        case LYXP_TOKEN_DDOT:
            ++(*exp_idx);
            break;

        case LYXP_TOKEN_AT:
            ++(*exp_idx);

            if (exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_NONE, 1)) {
                return -1;
            }
            if ((exp->tokens[*exp_idx] != LYXP_TOKEN_NAMETEST) && (exp->tokens[*exp_idx] != LYXP_TOKEN_NODETYPE)) {
                LOGVAL(ctx, LYE_XPATH_INTOK, LY_VLOG_NONE, NULL,
                       print_token(exp->tokens[*exp_idx]), &exp->expr[exp->expr_pos[*exp_idx]]);
                return -1;
            }
            /* fall through */
        case LYXP_TOKEN_NAMETEST:
            ++(*exp_idx);
            goto reparse_predicate;
            break;

        case LYXP_TOKEN_NODETYPE:
            ++(*exp_idx);

            /* '(' */
            if (exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_PAR1, 1)) {
                return -1;
            }
            ++(*exp_idx);

            /* ')' */
            if (exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_PAR2, 1)) {
                return -1;
            }
            ++(*exp_idx);

reparse_predicate:
            /* Predicate* */
            while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_BRACK1)) {
                if (reparse_predicate(ctx, exp, exp_idx)) {
                    return -1;
                }
            }
            break;
        default:
            LOGVAL(ctx, LYE_XPATH_INTOK, LY_VLOG_NONE, NULL,
                   print_token(exp->tokens[*exp_idx]), &exp->expr[exp->expr_pos[*exp_idx]]);
            return -1;
        }
    } while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_PATH));

    return EXIT_SUCCESS;
}